

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__tga_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  uchar uVar1;
  stbi_uc *psVar2;
  byte bVar3;
  stbi_uc sVar4;
  byte bVar5;
  stbi_uc sVar6;
  stbi_uc sVar7;
  stbi_uc sVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  int iVar16;
  uint uVar17;
  stbi_uc *out;
  undefined8 extraout_RDX;
  undefined7 uVar18;
  uint x_00;
  uint uVar19;
  uint *puVar20;
  uint uVar21;
  int iVar22;
  uchar *puVar23;
  int iVar24;
  int z;
  ulong uVar25;
  uint *data;
  uint uVar26;
  ulong __n;
  bool bVar27;
  uchar raw_data [4];
  uint local_8c;
  stbi_uc local_7c [4];
  stbi_uc *local_78;
  uint local_6c;
  uint *local_68;
  undefined4 local_60;
  undefined4 local_5c;
  ulong local_58;
  uint *local_50;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  local_68 = (uint *)y;
  local_50 = (uint *)x;
  local_44 = req_comp;
  bVar3 = stbi__get8(s);
  sVar4 = stbi__get8(s);
  bVar5 = stbi__get8(s);
  sVar6 = stbi__get8(s);
  sVar7 = stbi__get8(s);
  sVar8 = stbi__get8(s);
  local_78 = (stbi_uc *)CONCAT71(local_78._1_7_,sVar8);
  bVar9 = stbi__get8(s);
  bVar10 = stbi__get8(s);
  stbi__get8(s);
  stbi__get8(s);
  stbi__get8(s);
  stbi__get8(s);
  bVar11 = stbi__get8(s);
  bVar12 = stbi__get8(s);
  sVar8 = stbi__get8(s);
  local_58 = CONCAT71(local_58._1_7_,sVar8);
  bVar13 = stbi__get8(s);
  bVar14 = stbi__get8(s);
  bVar15 = stbi__get8(s);
  local_7c[0] = '\0';
  local_7c[1] = '\0';
  local_7c[2] = '\0';
  local_7c[3] = '\0';
  uVar18 = (undefined7)((ulong)extraout_RDX >> 8);
  if (sVar4 == '\0') {
    if (bVar14 < 0x10) {
      if (bVar14 != 8) {
        if (bVar14 == 0xf) goto LAB_00121cf9;
        goto LAB_00121d0b;
      }
LAB_00121d04:
      uVar19 = 1;
    }
    else if ((bVar14 == 0x20) || (bVar14 == 0x18)) {
      uVar19 = (uint)(bVar14 >> 3);
    }
    else {
      if (bVar14 != 0x10) goto LAB_00121d0b;
      uVar19 = bVar5 - 8;
      if (bVar5 < 8) {
        uVar19 = (uint)bVar5;
      }
      if (uVar19 != 3) goto LAB_00121cf9;
      uVar19 = uVar19 == 3 ^ 3;
    }
LAB_00121d17:
    local_60 = (undefined4)CONCAT71(uVar18,1);
    local_5c = 0;
  }
  else {
    uVar19 = (uint)bVar10;
    if (uVar19 < 0x18) {
      if (uVar19 - 0xf < 2) {
LAB_00121cf9:
        uVar19 = 3;
        local_5c = 1;
        local_60 = 0;
        goto LAB_00121d19;
      }
      if (uVar19 == 8) goto LAB_00121d04;
    }
    else if ((uVar19 == 0x18) || (uVar19 == 0x20)) {
      uVar19 = (uint)(bVar10 >> 3);
      goto LAB_00121d17;
    }
LAB_00121d0b:
    local_60 = (undefined4)CONCAT71(uVar18,1);
    local_5c = 0;
    uVar19 = 0;
  }
LAB_00121d19:
  if (uVar19 == 0) {
    stbi__g_failure_reason = "bad format";
    return (void *)0x0;
  }
  local_38 = (ulong)bVar11;
  local_40 = local_58 & 0xff;
  x_00 = (uint)bVar12 * 0x100 + (uint)bVar11;
  uVar26 = (uint)bVar13 * 0x100 + (uint)(byte)local_58;
  *local_50 = x_00;
  *local_68 = uVar26;
  if (comp != (int *)0x0) {
    *comp = uVar19;
  }
  local_58 = (ulong)((uint)bVar13 * 0x100);
  iVar16 = stbi__mad3sizes_valid(x_00,uVar26,uVar19,0);
  if (iVar16 == 0) {
    stbi__g_failure_reason = "too large";
    return (void *)0x0;
  }
  local_68 = (uint *)stbi__malloc_mad3(x_00,uVar26,uVar19,0);
  if (local_68 != (uint *)0x0) {
    stbi__skip(s,(uint)bVar3);
    data = local_68;
    local_6c = uVar26;
    if ((bVar5 < 8 && sVar4 == '\0') && (char)local_5c == '\0') {
      if (uVar26 != 0) {
        iVar16 = (int)local_58 + (int)local_40;
        iVar24 = 0;
        do {
          iVar16 = iVar16 + -1;
          iVar22 = iVar24;
          if ((bVar15 >> 5 & 1) == 0) {
            iVar22 = iVar16;
          }
          stbi__getn(s,(stbi_uc *)((long)data + (long)(int)(iVar22 * uVar19 * x_00)),uVar19 * x_00);
          iVar24 = iVar24 + 1;
        } while (iVar16 != 0);
      }
    }
    else {
      bVar3 = (byte)local_78;
      uVar26 = (uint)bVar9 * 0x100 + (uint)(byte)local_78;
      if (sVar4 == '\0') {
        local_78 = (stbi_uc *)0x0;
        psVar2 = local_78;
      }
      else {
        stbi__skip(s,(uint)CONCAT11(sVar7,sVar6));
        out = (stbi_uc *)stbi__malloc_mad2(uVar26,uVar19,0);
        data = local_68;
        if (out == (stbi_uc *)0x0) {
          free(local_68);
          goto LAB_00121ef2;
        }
        psVar2 = out;
        if ((char)local_60 == '\0') {
          if (uVar19 != 3) {
            __assert_fail("tga_comp == STBI_rgb",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/stb/stb_image.h"
                          ,0x1545,
                          "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                         );
          }
          if (uVar26 != 0) {
            uVar17 = (uint)CONCAT11(bVar9,bVar3);
            local_78 = out;
            do {
              stbi__tga_read_rgb16(s,out);
              out = out + 3;
              uVar17 = uVar17 - 1;
              psVar2 = local_78;
            } while (uVar17 != 0);
          }
        }
        else {
          iVar16 = stbi__getn(s,out,uVar19 * uVar26);
          if (iVar16 == 0) {
            free(data);
            free(out);
            stbi__g_failure_reason = "bad palette";
            return (void *)0x0;
          }
        }
      }
      local_78 = psVar2;
      if (local_6c * x_00 != 0) {
        __n = (ulong)(uVar19 + (uVar19 == 0));
        local_50 = (uint *)(ulong)(local_6c * x_00);
        puVar20 = (uint *)0x0;
        bVar3 = 0;
        local_8c = 0;
        iVar16 = 0;
        do {
          if (bVar5 < 8) {
LAB_00121fad:
            bVar27 = false;
          }
          else {
            if (iVar16 == 0) {
              bVar3 = stbi__get8(s);
              iVar16 = (bVar3 & 0x7f) + 1;
              local_8c = (uint)(bVar3 >> 7);
              goto LAB_00121fad;
            }
            bVar27 = (bool)(bVar3 & local_8c != 0);
            local_8c = (uint)(local_8c != 0);
          }
          if (!bVar27) {
            if (sVar4 == '\0') {
              if ((char)local_60 == '\0') {
                if (uVar19 != 3) {
                  __assert_fail("tga_comp == STBI_rgb",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/stb/stb_image.h"
                                ,0x1576,
                                "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                               );
                }
                stbi__tga_read_rgb16(s,local_7c);
              }
              else {
                uVar25 = 0;
                do {
                  sVar6 = stbi__get8(s);
                  local_7c[uVar25] = sVar6;
                  uVar25 = uVar25 + 1;
                } while (__n != uVar25);
              }
            }
            else {
              bVar3 = stbi__get8(s);
              uVar17 = (uint)bVar3;
              if (bVar14 != 8) {
                sVar6 = stbi__get8(s);
                uVar17 = (uint)CONCAT11(sVar6,bVar3);
              }
              if (uVar26 <= uVar17) {
                uVar17 = 0;
              }
              memcpy(local_7c,local_78 + uVar17 * uVar19,__n);
            }
          }
          data = local_68;
          memcpy((uchar *)((long)local_68 + (ulong)(uVar19 * (int)puVar20)),local_7c,__n);
          iVar16 = iVar16 + -1;
          puVar20 = (uint *)((long)puVar20 + 1);
          bVar3 = 1;
        } while (puVar20 != local_50);
      }
      if (local_6c != 0 && (bVar15 >> 5 & 1) == 0) {
        iVar16 = uVar19 * x_00;
        uVar17 = ((int)local_58 + (int)local_40) - 1;
        iVar24 = ((uint)bVar12 * 0x100 | (uint)local_38) * uVar19 * uVar17;
        uVar21 = 0;
        uVar26 = 0;
        do {
          if (iVar16 != 0) {
            puVar23 = (uchar *)data;
            iVar22 = iVar16 + 1;
            do {
              uVar1 = puVar23[uVar21];
              puVar23[uVar21] = puVar23[iVar24];
              puVar23[iVar24] = uVar1;
              puVar23 = puVar23 + 1;
              iVar22 = iVar22 + -1;
            } while (1 < iVar22);
          }
          iVar24 = iVar24 - iVar16;
          uVar21 = uVar21 + iVar16;
          bVar27 = uVar26 != uVar17 >> 1;
          uVar26 = uVar26 + 1;
        } while (bVar27);
      }
      if (local_78 != (stbi_uc *)0x0) {
        free(local_78);
      }
    }
    if (((char)local_5c == '\0' && 2 < uVar19) && (iVar16 = local_6c * x_00, iVar16 != 0)) {
      puVar23 = (uchar *)((long)data + 2);
      do {
        uVar1 = puVar23[-2];
        puVar23[-2] = *puVar23;
        *puVar23 = uVar1;
        puVar23 = puVar23 + uVar19;
        iVar16 = iVar16 + -1;
      } while (iVar16 != 0);
    }
    if (local_44 != 0) {
      if (uVar19 != local_44) {
        puVar23 = stbi__convert_format((uchar *)data,uVar19,local_44,x_00,local_6c);
        return puVar23;
      }
      return (uchar *)data;
    }
    return (uchar *)data;
  }
LAB_00121ef2:
  stbi__g_failure_reason = "outofmem";
  return (void *)0x0;
}

Assistant:

static void *stbi__tga_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   //   read in the TGA header stuff
   int tga_offset = stbi__get8(s);
   int tga_indexed = stbi__get8(s);
   int tga_image_type = stbi__get8(s);
   int tga_is_RLE = 0;
   int tga_palette_start = stbi__get16le(s);
   int tga_palette_len = stbi__get16le(s);
   int tga_palette_bits = stbi__get8(s);
   int tga_x_origin = stbi__get16le(s);
   int tga_y_origin = stbi__get16le(s);
   int tga_width = stbi__get16le(s);
   int tga_height = stbi__get16le(s);
   int tga_bits_per_pixel = stbi__get8(s);
   int tga_comp, tga_rgb16=0;
   int tga_inverted = stbi__get8(s);
   // int tga_alpha_bits = tga_inverted & 15; // the 4 lowest bits - unused (useless?)
   //   image data
   unsigned char *tga_data;
   unsigned char *tga_palette = NULL;
   int i, j;
   unsigned char raw_data[4] = {0};
   int RLE_count = 0;
   int RLE_repeating = 0;
   int read_next_pixel = 1;
   STBI_NOTUSED(ri);

   //   do a tiny bit of precessing
   if ( tga_image_type >= 8 )
   {
      tga_image_type -= 8;
      tga_is_RLE = 1;
   }
   tga_inverted = 1 - ((tga_inverted >> 5) & 1);

   //   If I'm paletted, then I'll use the number of bits from the palette
   if ( tga_indexed ) tga_comp = stbi__tga_get_comp(tga_palette_bits, 0, &tga_rgb16);
   else tga_comp = stbi__tga_get_comp(tga_bits_per_pixel, (tga_image_type == 3), &tga_rgb16);

   if(!tga_comp) // shouldn't really happen, stbi__tga_test() should have ensured basic consistency
      return stbi__errpuc("bad format", "Can't find out TGA pixelformat");

   //   tga info
   *x = tga_width;
   *y = tga_height;
   if (comp) *comp = tga_comp;

   if (!stbi__mad3sizes_valid(tga_width, tga_height, tga_comp, 0))
      return stbi__errpuc("too large", "Corrupt TGA");

   tga_data = (unsigned char*)stbi__malloc_mad3(tga_width, tga_height, tga_comp, 0);
   if (!tga_data) return stbi__errpuc("outofmem", "Out of memory");

   // skip to the data's starting position (offset usually = 0)
   stbi__skip(s, tga_offset );

   if ( !tga_indexed && !tga_is_RLE && !tga_rgb16 ) {
      for (i=0; i < tga_height; ++i) {
         int row = tga_inverted ? tga_height -i - 1 : i;
         stbi_uc *tga_row = tga_data + row*tga_width*tga_comp;
         stbi__getn(s, tga_row, tga_width * tga_comp);
      }
   } else  {
      //   do I need to load a palette?
      if ( tga_indexed)
      {
         //   any data to skip? (offset usually = 0)
         stbi__skip(s, tga_palette_start );
         //   load the palette
         tga_palette = (unsigned char*)stbi__malloc_mad2(tga_palette_len, tga_comp, 0);
         if (!tga_palette) {
            STBI_FREE(tga_data);
            return stbi__errpuc("outofmem", "Out of memory");
         }
         if (tga_rgb16) {
            stbi_uc *pal_entry = tga_palette;
            STBI_ASSERT(tga_comp == STBI_rgb);
            for (i=0; i < tga_palette_len; ++i) {
               stbi__tga_read_rgb16(s, pal_entry);
               pal_entry += tga_comp;
            }
         } else if (!stbi__getn(s, tga_palette, tga_palette_len * tga_comp)) {
               STBI_FREE(tga_data);
               STBI_FREE(tga_palette);
               return stbi__errpuc("bad palette", "Corrupt TGA");
         }
      }
      //   load the data
      for (i=0; i < tga_width * tga_height; ++i)
      {
         //   if I'm in RLE mode, do I need to get a RLE stbi__pngchunk?
         if ( tga_is_RLE )
         {
            if ( RLE_count == 0 )
            {
               //   yep, get the next byte as a RLE command
               int RLE_cmd = stbi__get8(s);
               RLE_count = 1 + (RLE_cmd & 127);
               RLE_repeating = RLE_cmd >> 7;
               read_next_pixel = 1;
            } else if ( !RLE_repeating )
            {
               read_next_pixel = 1;
            }
         } else
         {
            read_next_pixel = 1;
         }
         //   OK, if I need to read a pixel, do it now
         if ( read_next_pixel )
         {
            //   load however much data we did have
            if ( tga_indexed )
            {
               // read in index, then perform the lookup
               int pal_idx = (tga_bits_per_pixel == 8) ? stbi__get8(s) : stbi__get16le(s);
               if ( pal_idx >= tga_palette_len ) {
                  // invalid index
                  pal_idx = 0;
               }
               pal_idx *= tga_comp;
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = tga_palette[pal_idx+j];
               }
            } else if(tga_rgb16) {
               STBI_ASSERT(tga_comp == STBI_rgb);
               stbi__tga_read_rgb16(s, raw_data);
            } else {
               //   read in the data raw
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = stbi__get8(s);
               }
            }
            //   clear the reading flag for the next pixel
            read_next_pixel = 0;
         } // end of reading a pixel

         // copy data
         for (j = 0; j < tga_comp; ++j)
           tga_data[i*tga_comp+j] = raw_data[j];

         //   in case we're in RLE mode, keep counting down
         --RLE_count;
      }
      //   do I need to invert the image?
      if ( tga_inverted )
      {
         for (j = 0; j*2 < tga_height; ++j)
         {
            int index1 = j * tga_width * tga_comp;
            int index2 = (tga_height - 1 - j) * tga_width * tga_comp;
            for (i = tga_width * tga_comp; i > 0; --i)
            {
               unsigned char temp = tga_data[index1];
               tga_data[index1] = tga_data[index2];
               tga_data[index2] = temp;
               ++index1;
               ++index2;
            }
         }
      }
      //   clear my palette, if I had one
      if ( tga_palette != NULL )
      {
         STBI_FREE( tga_palette );
      }
   }

   // swap RGB - if the source data was RGB16, it already is in the right order
   if (tga_comp >= 3 && !tga_rgb16)
   {
      unsigned char* tga_pixel = tga_data;
      for (i=0; i < tga_width * tga_height; ++i)
      {
         unsigned char temp = tga_pixel[0];
         tga_pixel[0] = tga_pixel[2];
         tga_pixel[2] = temp;
         tga_pixel += tga_comp;
      }
   }

   // convert to target component count
   if (req_comp && req_comp != tga_comp)
      tga_data = stbi__convert_format(tga_data, tga_comp, req_comp, tga_width, tga_height);

   //   the things I do to get rid of an error message, and yet keep
   //   Microsoft's C compilers happy... [8^(
   tga_palette_start = tga_palette_len = tga_palette_bits =
         tga_x_origin = tga_y_origin = 0;
   //   OK, done
   return tga_data;
}